

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture3DProjGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Texture3D *pTVar5;
  int i_1;
  int i;
  long lVar6;
  float lod;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  tcu local_28 [16];
  
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar5 = c->textures[0].tex3D;
  fVar4 = c->in[0].m_data[2];
  lVar6 = 0;
  lod = glu::TextureTestUtil::computeLodFromDerivates
                  (LODMODE_EXACT,c->in[1].m_data[0] * (float)pTVar5->m_width,
                   c->in[1].m_data[1] * (float)pTVar5->m_height,
                   c->in[1].m_data[2] * (float)pTVar5->m_depth,
                   (float)pTVar5->m_width * c->in[2].m_data[0],
                   (float)pTVar5->m_height * c->in[2].m_data[1],
                   (float)pTVar5->m_depth * c->in[2].m_data[2]);
  pTVar5 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            (local_28,(pTVar5->m_view).m_levels,(pTVar5->m_view).m_numLevels,&c->textures[0].sampler
             ,fVar2 / fVar1,fVar3 / fVar1,fVar4 / fVar1,lod);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  do {
    local_48[lVar6] = *(float *)(local_28 + lVar6 * 4) * (p->scale).m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar6 = 0;
  do {
    *(float *)((long)&local_38 + lVar6 * 4) = local_48[lVar6] + (p->bias).m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture3DProjGrad			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), computeLodFromGrad3D(c))*p.scale + p.bias; }